

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void satoko_sort(void **data,uint size,_func_int_void_ptr_void_ptr *comp_fn)

{
  void **ppvVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  void *pvVar6;
  int iVar7;
  clause_conflict *c2;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  clause_conflict *c1;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  clause_conflict *c2_1;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  void **comp_fn_00;
  ulong uVar16;
  
LAB_008feae5:
  if (size < 0x10) {
    if (size - 1 != 0) {
      uVar9 = 1;
      uVar11 = 0;
      do {
        uVar2 = uVar11 + 1;
        if (uVar2 < size) {
          uVar12 = uVar9;
          uVar15 = uVar11 & 0xffffffff;
          do {
            puVar3 = (uint *)data[uVar12];
            puVar4 = (uint *)data[uVar15];
            uVar13 = puVar3[1];
            if (((ulong)uVar13 < 3) || (puVar4[1] != 2)) {
              uVar16 = uVar15;
              if ((uVar13 != 2) || (puVar4[1] < 2)) {
                if (*puVar4 >> 4 < *puVar3 >> 4) goto LAB_008fec5c;
                if ((*puVar4 >> 4 <= *puVar3 >> 4) &&
                   (uVar16 = uVar12 & 0xffffffff,
                   puVar4[(ulong)puVar4[1] + 2] <= puVar3[(ulong)uVar13 + 2])) {
                  uVar16 = uVar15;
                }
              }
            }
            else {
LAB_008fec5c:
              uVar16 = uVar12 & 0xffffffff;
            }
            uVar13 = (uint)uVar16;
            uVar12 = uVar12 + 1;
            uVar15 = uVar16;
          } while (size != (uint)uVar12);
        }
        else {
          uVar13 = (uint)uVar11;
        }
        pvVar6 = data[uVar11];
        data[uVar11] = data[uVar13];
        data[uVar13] = pvVar6;
        uVar9 = uVar9 + 1;
        uVar11 = uVar2;
      } while (uVar2 != size - 1);
    }
    return;
  }
  puVar3 = (uint *)data[size >> 1];
  uVar13 = puVar3[1];
  ppvVar1 = data + 1;
  lVar19 = -1;
  uVar10 = size;
LAB_008feb0d:
  uVar18 = (uint)lVar19;
  lVar14 = (long)(int)uVar18;
  lVar17 = 0;
  lVar20 = 0;
  while( true ) {
    puVar4 = (uint *)ppvVar1[lVar14 + lVar20];
    uVar8 = puVar4[1];
    if ((((ulong)uVar8 < 3) || (puVar3[1] != 2)) &&
       (((uVar8 == 2 && (1 < puVar3[1])) ||
        ((*puVar4 >> 4 <= *puVar3 >> 4 &&
         ((*puVar4 >> 4 < *puVar3 >> 4 || (puVar3[(ulong)puVar3[1] + 2] <= puVar4[(ulong)uVar8 + 2])
          ))))))) break;
    lVar20 = lVar20 + 1;
    lVar17 = lVar17 + -8;
  }
  iVar7 = (int)lVar20;
  lVar19 = lVar14 + lVar20 + 1;
  comp_fn_00 = ppvVar1;
LAB_008feb7a:
  do {
    uVar10 = uVar10 - 1;
    puVar5 = (uint *)data[uVar10];
    if (2 < uVar13) {
      if (puVar5[1] == 2) goto LAB_008feb7a;
    }
    if ((uVar13 == 2) && (1 < puVar5[1])) break;
    uVar8 = *puVar5 >> 4;
    comp_fn_00 = (void **)(ulong)uVar8;
    if ((*puVar3 >> 4 <= uVar8) &&
       ((*puVar3 >> 4 < uVar8 ||
        (comp_fn_00 = (void **)(ulong)puVar3[(ulong)uVar13 + 2],
        puVar5[(ulong)puVar5[1] + 2] <= puVar3[(ulong)uVar13 + 2])))) break;
  } while( true );
  if (uVar10 <= uVar18 + 1 + iVar7) goto LAB_008febd1;
  ppvVar1[lVar14 + lVar20] = puVar5;
  data[uVar10] = puVar4;
  goto LAB_008feb0d;
LAB_008febd1:
  satoko_sort(data,uVar18 + iVar7 + 1,(_func_int_void_ptr_void_ptr *)comp_fn_00);
  data = (void **)((long)data + ((long)(int)uVar18 * 8 - lVar17) + 8);
  size = (~uVar18 + size) - iVar7;
  goto LAB_008feae5;
}

Assistant:

static void satoko_sort(void **data, unsigned size,
            int (*comp_fn)(const void *, const void *))
{
    if (size <= 15)
        select_sort(data, size, comp_fn);
    else {
        void *pivot = data[size / 2];
        void *temp;
        unsigned j = size;
        int i = -1;

        for (;;) {
            do {
                i++;
            } while (comp_fn(data[i], pivot));
            do {
                j--;
            } while (comp_fn(pivot, data[j]));

            if ((unsigned) i >= j)
                break;

            temp = data[i];
            data[i] = data[j];
            data[j] = temp;
        }
        satoko_sort(data, (unsigned) i, comp_fn);
        satoko_sort(data + i, (size - (unsigned) i), comp_fn);
    }
}